

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O2

Vec_Int_t * Acb_ObjCollectTfoVec(Acb_Ntk_t *p,Vec_Int_t *vObjs)

{
  int iObj;
  int i;
  
  if ((p->vFanouts).nSize < 1) {
    Acb_NtkCreateFanout(p);
  }
  (p->vArray1).nSize = 0;
  Acb_NtkIncTravId(p);
  for (i = 0; i < vObjs->nSize; i = i + 1) {
    iObj = Vec_IntEntry(vObjs,i);
    Acb_ObjCollectTfo_rec(p,iObj,0);
  }
  return &p->vArray1;
}

Assistant:

Vec_Int_t * Acb_ObjCollectTfoVec( Acb_Ntk_t * p, Vec_Int_t * vObjs )
{
    int i, iObj;
    if ( !Acb_NtkHasObjFanout(p) )
        Acb_NtkCreateFanout( p );
    Vec_IntClear( &p->vArray1 );
    Acb_NtkIncTravId( p );
    Vec_IntForEachEntry( vObjs, iObj, i )
        Acb_ObjCollectTfo_rec( p, iObj, 0 );
    return &p->vArray1;
}